

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O0

int run_test_random_async(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  uv_random_t req;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_random(loop_00,&loop,scratch,0x100,0xffffffff,random_cb);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x3a,"UV_EINVAL","==","uv_random(loop, &req, scratch, sizeof(scratch), -1, random_cb)",
            0xffffffffffffffea,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_random(loop_00,&loop,scratch,0xffffffffffffffff,0xffffffff,random_cb);
  if ((long)iVar1 != -7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x3b,"UV_E2BIG","==","uv_random(loop, &req, scratch, -1, -1, random_cb)",
            0xfffffffffffffff9,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_random(loop_00,&loop,scratch,0,0,random_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x3d,"uv_random(loop, &req, scratch, 0, 0, random_cb)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)random_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x3e,"random_cb_called","==","0",(long)random_cb_called,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x40,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)random_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x41,"1","==","random_cb_called",1,"==",(long)random_cb_called);
    abort();
  }
  iVar1 = uv_random(loop_00,&loop,scratch,0x100,0,random_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x43,"uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  if ((long)random_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x44,"1","==","random_cb_called",1,"==",(long)random_cb_called);
    abort();
  }
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x46,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)random_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x47,"2","==","random_cb_called",2,"==",(long)random_cb_called);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x49,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_EQ(UV_EINVAL, uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                 random_cb));
  ASSERT_EQ(UV_E2BIG, uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT_OK(uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT_OK(random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(2, random_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}